

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void pabsd_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  Int32 IVar4;
  Int32 IVar5;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    (pMyDisasm->Instruction).Category = 0x30002;
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pabsd",6);
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      return;
    }
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pabsd",6);
    (pMyDisasm->Reserved_).Register_ = 2;
    GxEx(pMyDisasm);
    return;
  }
  if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpabsd",7);
  if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    vex_GxEx(pMyDisasm);
    return;
  }
  verifyVEXvvvv(pMyDisasm);
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 0x6d;
    IVar3 = 4;
    IVar4 = 0x110000;
  }
  else {
    if (UVar1 != '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
        return;
      }
      IVar2 = 0x72;
      IVar3 = 0x10;
      IVar5 = 0x140000;
      goto LAB_00133cb4;
    }
    IVar2 = 0x6e;
    IVar3 = 8;
    IVar4 = 0x120000;
  }
  IVar5 = 0x140000;
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    IVar5 = IVar4;
  }
LAB_00133cb4:
  (pMyDisasm->Instruction).Category = IVar5;
  (pMyDisasm->Reserved_).Register_ = IVar3;
  (pMyDisasm->Reserved_).MemDecoration = IVar2;
  GxEx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ pabsd_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpabsd");
      #endif
      if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      vex_GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = MMX_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128_xmm;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pabsd");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      GV.MemDecoration = Arg2qword;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pabsd");
      #endif
      GV.Register_ = MMX_REG;
      GxEx(pMyDisasm);
    }
  }
}